

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall QNetworkProxy::setCapabilities(QNetworkProxy *this,Capabilities capabilities)

{
  long lVar1;
  QNetworkProxyPrivate *pQVar2;
  Int in_ESI;
  QSharedDataPointer<QNetworkProxyPrivate> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(in_RDI);
  (pQVar2->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
  super_QFlagsStorage<QNetworkProxy::Capability>.i = in_ESI;
  pQVar2 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(in_RDI);
  pQVar2->capabilitiesSet = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkProxy::setCapabilities(Capabilities capabilities)
{
    d->capabilities = capabilities;
    d->capabilitiesSet = true;
}